

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetSceneMeshBuffersMSFT
                   (XrSceneMSFT scene,XrSceneMeshBuffersGetInfoMSFT *getInfo,
                   XrSceneMeshBuffersMSFT *buffers)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrResult XVar3;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrSceneMSFT_T *in_stack_fffffffffffffd68;
  string local_290;
  string local_270;
  XrSceneMSFT scene_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9c44e9;
  scene_local = scene;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSceneMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&scene_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSceneMSFTHandle(&scene_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSceneMSFT_T_*>::getWithInstanceInfo(&g_scenemsft_info,scene_local);
    instance_info = pVar4.second;
    if (getInfo == (XrSceneMeshBuffersGetInfoMSFT *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetSceneMeshBuffersMSFT-getInfo-parameter",
                 (allocator *)&local_230);
      std::__cxx11::string::string
                ((string *)&local_290,"xrGetSceneMeshBuffersMSFT",
                 (allocator *)&stack0xfffffffffffffd6f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Invalid NULL for XrSceneMeshBuffersGetInfoMSFT \"getInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd6e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_1c8;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrGetSceneMeshBuffersMSFT",(allocator *)&local_290);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,getInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) {
        if (buffers == (XrSceneMeshBuffersMSFT *)0x0) {
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetSceneMeshBuffersMSFT-buffers-parameter",
                     (allocator *)&local_230);
          std::__cxx11::string::string
                    ((string *)&local_290,"xrGetSceneMeshBuffersMSFT",
                     (allocator *)&stack0xfffffffffffffd6f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_1f8,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_270,
                     "Invalid NULL for XrSceneMeshBuffersMSFT \"buffers\" which is not optional and must be non-NULL"
                     ,(allocator *)&stack0xfffffffffffffd6e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_290,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_1f8,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          this = &local_1f8;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&oss,"xrGetSceneMeshBuffersMSFT",(allocator *)&local_290);
          XVar2 = XR_SUCCESS;
          XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,buffers);
          std::__cxx11::string::~string((string *)&oss);
          if (XVar3 == XR_SUCCESS) goto LAB_001dda4a;
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetSceneMeshBuffersMSFT-buffers-parameter",
                     (allocator *)&local_230);
          std::__cxx11::string::string
                    ((string *)&local_290,"xrGetSceneMeshBuffersMSFT",
                     (allocator *)&stack0xfffffffffffffd6f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_210,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_270,
                     "Command xrGetSceneMeshBuffersMSFT param buffers is invalid",
                     (allocator *)&stack0xfffffffffffffd6e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_290,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_210,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          this = &local_210;
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrGetSceneMeshBuffersMSFT-getInfo-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrGetSceneMeshBuffersMSFT",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,"Command xrGetSceneMeshBuffersMSFT param getInfo is invalid"
                   ,(allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e0,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_1e0;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSceneMSFT handle \"scene\" ");
    HandleToHexString<XrSceneMSFT_T*>(in_stack_fffffffffffffd68);
    std::operator<<((ostream *)&oss,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrGetSceneMeshBuffersMSFT-scene-parameter",
               (allocator *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::string
              ((string *)&local_270,"xrGetSceneMeshBuffersMSFT",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_290,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001dda4a:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetSceneMeshBuffersMSFT(
XrSceneMSFT scene,
const XrSceneMeshBuffersGetInfoMSFT* getInfo,
XrSceneMeshBuffersMSFT* buffers) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(scene, XR_OBJECT_TYPE_SCENE_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSceneMSFTHandle(&scene);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSceneMSFT handle \"scene\" ";
                oss << HandleToHexString(scene);
                CoreValidLogMessage(nullptr, "VUID-xrGetSceneMeshBuffersMSFT-scene-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMeshBuffersMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_scenemsft_info.getWithInstanceInfo(scene);
        GenValidUsageXrHandleInfo *gen_scenemsft_info = info_with_instance.first;
        (void)gen_scenemsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMeshBuffersMSFT-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMeshBuffersMSFT", objects_info,
                                "Invalid NULL for XrSceneMeshBuffersGetInfoMSFT \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSceneMeshBuffersGetInfoMSFT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetSceneMeshBuffersMSFT", objects_info,
                                                        true, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMeshBuffersMSFT-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMeshBuffersMSFT",
                                objects_info,
                                "Command xrGetSceneMeshBuffersMSFT param getInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == buffers) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMeshBuffersMSFT-buffers-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMeshBuffersMSFT", objects_info,
                                "Invalid NULL for XrSceneMeshBuffersMSFT \"buffers\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSceneMeshBuffersMSFT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetSceneMeshBuffersMSFT", objects_info,
                                                        false, true, buffers);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSceneMeshBuffersMSFT-buffers-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSceneMeshBuffersMSFT",
                                objects_info,
                                "Command xrGetSceneMeshBuffersMSFT param buffers is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}